

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.h
# Opt level: O0

void __thiscall
FIX::DataDictionary::checkIsInMessage(DataDictionary *this,FieldBase *field,MsgType *msgType)

{
  bool bVar1;
  int iVar2;
  string *msgType_00;
  TagNotDefinedForMessage *this_00;
  allocator<char> local_41;
  string local_40;
  MsgType *local_20;
  MsgType *msgType_local;
  FieldBase *field_local;
  DataDictionary *this_local;
  
  local_20 = msgType;
  msgType_local = (MsgType *)field;
  field_local = (FieldBase *)this;
  msgType_00 = StringField::operator_cast_to_string_(&msgType->super_StringField);
  iVar2 = FieldBase::getTag((FieldBase *)msgType_local);
  bVar1 = isMsgField(this,msgType_00,iVar2);
  if (!bVar1) {
    this_00 = (TagNotDefinedForMessage *)__cxa_allocate_exception(0x58);
    iVar2 = FieldBase::getTag((FieldBase *)msgType_local);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"",&local_41);
    TagNotDefinedForMessage::TagNotDefinedForMessage(this_00,iVar2,&local_40);
    __cxa_throw(this_00,&TagNotDefinedForMessage::typeinfo,
                TagNotDefinedForMessage::~TagNotDefinedForMessage);
  }
  return;
}

Assistant:

void checkIsInMessage
  ( const FieldBase& field, const MsgType& msgType ) const
  EXCEPT ( TagNotDefinedForMessage )
  {
    if ( !isMsgField( msgType, field.getTag() ) )
      throw TagNotDefinedForMessage( field.getTag() );
  }